

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O2

uint64_t __thiscall
absl::lts_20250127::anon_unknown_0::ShiftRightAndRound
          (anon_unknown_0 *this,uint128 value,int shift,bool input_exact,
          Nonnull<bool_*> output_exact)

{
  byte *pbVar1;
  uint64_t uVar2;
  byte bVar4;
  char cVar5;
  undefined7 in_register_00000081;
  undefined1 auVar7 [16];
  uint128 uVar8;
  uint128 uVar9;
  uint128 uVar10;
  uint128 local_48;
  ulong uVar3;
  ulong uVar6;
  
  uVar10.hi_ = value.lo_;
  pbVar1 = (byte *)CONCAT71(in_register_00000081,input_exact);
  cVar5 = (char)value.hi_;
  bVar4 = (byte)shift;
  if ((int)(uint)value.hi_ < 1) {
    *pbVar1 = bVar4;
    uVar2 = __ashlti3(this,uVar10.hi_,-cVar5);
  }
  else {
    *pbVar1 = 1;
    if ((uint)value.hi_ < 0x80) {
      auVar7 = __ashlti3(0xffffffffffffffff,0xffffffffffffffff,cVar5);
      uVar8 = (uint128)__ashlti3(1,0,cVar5 + -1);
      uVar6 = uVar8.hi_;
      uVar3 = uVar8.lo_;
      uVar9.hi_ = ~auVar7._8_8_;
      uVar9.lo_ = ~auVar7._0_8_;
      uVar10.lo_ = (uint64_t)this;
      uVar9 = operator&(uVar10,uVar9);
      local_48 = (uint128)__lshrti3(this,uVar10.hi_,cVar5);
      uVar2 = local_48.lo_;
      if (uVar6 < uVar9.hi_ || uVar6 - uVar9.hi_ < (ulong)(uVar3 < uVar9.lo_)) {
        uVar2 = uVar2 + 1;
      }
      else if (uVar9 == uVar8) {
        uVar10 = operator&(local_48,(uint128)ZEXT816(1));
        if ((bVar4 & (uVar10.lo_ != 1 || uVar10.hi_ != 0)) == 0) {
          uint128::operator++(&local_48);
          uVar2 = local_48.lo_;
        }
      }
      else {
        uVar8.hi_ = (uVar6 - 1) + (ulong)(uVar3 != 0);
        uVar8.lo_ = uVar3 - 1;
        if ((bVar4 == 0) && (uVar9 == uVar8)) {
          *pbVar1 = 0;
        }
      }
    }
    else {
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

uint64_t ShiftRightAndRound(uint128 value, int shift, bool input_exact,
                            absl::Nonnull<bool*> output_exact) {
  if (shift <= 0) {
    *output_exact = input_exact;
    return static_cast<uint64_t>(value << -shift);
  }
  if (shift >= 128) {
    // Exponent is so small that we are shifting away all significant bits.
    // Answer will not be representable, even as a subnormal, so return a zero
    // mantissa (which represents underflow).
    *output_exact = true;
    return 0;
  }

  *output_exact = true;
  const uint128 shift_mask = (uint128(1) << shift) - 1;
  const uint128 halfway_point = uint128(1) << (shift - 1);

  const uint128 shifted_bits = value & shift_mask;
  value >>= shift;
  if (shifted_bits > halfway_point) {
    // Shifted bits greater than 10000... require rounding up.
    return static_cast<uint64_t>(value + 1);
  }
  if (shifted_bits == halfway_point) {
    // In exact mode, shifted bits of 10000... mean we're exactly halfway
    // between two numbers, and we must round to even.  So only round up if
    // the low bit of `value` is set.
    //
    // In inexact mode, the nonzero error means the actual value is greater
    // than the halfway point and we must always round up.
    if ((value & 1) == 1 || !input_exact) {
      ++value;
    }
    return static_cast<uint64_t>(value);
  }
  if (!input_exact && shifted_bits == halfway_point - 1) {
    // Rounding direction is unclear, due to error.
    *output_exact = false;
  }
  // Otherwise, round down.
  return static_cast<uint64_t>(value);
}